

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O3

int kvtree_unset_all(kvtree *hash)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem_struct **ppkVar2;
  kvtree_elem *unaff_RBX;
  
  if ((hash != (kvtree *)0x0) && (pkVar1 = hash->lh_first, pkVar1 != (kvtree_elem_struct *)0x0)) {
    ppkVar2 = (pkVar1->pointers).le_prev;
    for (pkVar1 = (pkVar1->pointers).le_next; pkVar1 != (kvtree_elem_struct *)0x0;
        pkVar1 = (pkVar1->pointers).le_next) {
      (pkVar1->pointers).le_prev = ppkVar2;
      *ppkVar2 = pkVar1;
      kvtree_elem_delete(unaff_RBX);
      ppkVar2 = (pkVar1->pointers).le_prev;
    }
    *ppkVar2 = (kvtree_elem_struct *)0x0;
    kvtree_elem_delete(unaff_RBX);
  }
  return 0;
}

Assistant:

int kvtree_unset_all(kvtree* hash)
{
  kvtree_elem* elem = kvtree_elem_first(hash);
  while (elem != NULL) {
    /* remember this element */
    kvtree_elem* tmp = elem;

    /* get the next element */
    elem = kvtree_elem_next(elem);

    /* extract and delete the current element by address */
    kvtree_elem_extract_by_addr(hash, tmp);
    kvtree_elem_delete(tmp);
  }
  return KVTREE_SUCCESS;
}